

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O1

UnknownField __thiscall google::protobuf::UnknownField::DeepCopy(UnknownField *this,Arena *arena)

{
  undefined4 uVar1;
  undefined4 uVar2;
  anon_union_8_5_75b44293_for_data_ this_00;
  UnknownField UVar3;
  anon_class_8_1_a7a63227 local_28;
  anon_class_8_1_a7a63227 local_20;
  
  uVar1 = this->number_;
  uVar2 = this->type_;
  UVar3.type_ = uVar2;
  UVar3.number_ = uVar1;
  if (this->type_ == 4) {
    this_00.group_ = Arena::CreateArenaCompatible<google::protobuf::UnknownFieldSet>(arena);
    UnknownFieldSet::MergeFrom(this_00.group_,(this->data_).group_);
  }
  else if (this->type_ == 3) {
    local_28.arena = arena;
    local_20.arena = arena;
    this_00.string_value =
         absl::lts_20240722::utility_internal::
         IfConstexprElse<false,google::protobuf::Arena::Create<std::__cxx11::string,std::__cxx11::string&>(google::protobuf::Arena*,std::__cxx11::string&)::_lambda((auto:1&&)___)_1_,google::protobuf::Arena::Create<std::__cxx11::string,std::__cxx11::string&>(google::protobuf::Arena*,std::__cxx11::string&)::_lambda((auto:1&&)___)_2_,std::__cxx11::string&>
                   (&local_20,&local_28,(this->data_).string_value);
  }
  else {
    this_00 = (anon_union_8_5_75b44293_for_data_)(this->data_).varint_;
  }
  UVar3.data_.varint_ = this_00.varint_;
  return UVar3;
}

Assistant:

UnknownField UnknownField::DeepCopy(Arena* arena) const {
  UnknownField copy = *this;
  switch (type()) {
    case UnknownField::TYPE_LENGTH_DELIMITED:
      copy.data_.string_value =
          Arena::Create<std::string>(arena, *data_.string_value);
      break;
    case UnknownField::TYPE_GROUP: {
      UnknownFieldSet* group = Arena::Create<UnknownFieldSet>(arena);
      group->MergeFrom(*data_.group_);
      copy.data_.group_ = group;
      break;
    }
    default:
      break;
  }
  return copy;
}